

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

bool QUtil::get_env(string *var,string *value)

{
  char *pcVar1;
  char *__s;
  
  __s = getenv((var->_M_dataplus)._M_p);
  if (value != (string *)0x0 && __s != (char *)0x0) {
    pcVar1 = (char *)value->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)value,0,pcVar1,(ulong)__s);
  }
  return __s != (char *)0x0;
}

Assistant:

bool
QUtil::get_env(std::string const& var, std::string* value)
{
    // This was basically ripped out of wxWindows.
#ifdef _WIN32
# ifdef NO_GET_ENVIRONMENT
    return false;
# else
    // first get the size of the buffer
    DWORD len = ::GetEnvironmentVariable(var.c_str(), NULL, 0);
    if (len == 0) {
        // this means that there is no such variable
        return false;
    }

    if (value) {
        auto t = QUtil::make_shared_array<char>(len + 1);
        ::GetEnvironmentVariable(var.c_str(), t.get(), len);
        *value = t.get();
    }

    return true;
# endif
#else
    char* p = getenv(var.c_str());
    if (p == nullptr) {
        return false;
    }
    if (value) {
        *value = p;
    }

    return true;
#endif
}